

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O2

void captureCursor(_GLFWwindow *window)

{
  Window WVar1;
  int iVar2;
  
  hideCursor(window);
  if ((window->x11).cursorGrabbed == '\0') {
    WVar1 = (window->x11).handle;
    iVar2 = XGrabPointer(_glfw.x11.display,WVar1,1,0x4c,1,1,WVar1,0,0);
    if (iVar2 == 0) {
      (window->x11).cursorGrabbed = '\x01';
    }
  }
  return;
}

Assistant:

static void captureCursor(_GLFWwindow* window)
{
    hideCursor(window);

    if (!window->x11.cursorGrabbed)
    {
        if (XGrabPointer(_glfw.x11.display, window->x11.handle, True,
                         ButtonPressMask | ButtonReleaseMask |
                         PointerMotionMask, GrabModeAsync, GrabModeAsync,
                         window->x11.handle, None, CurrentTime) ==
            GrabSuccess)
        {
            window->x11.cursorGrabbed = GL_TRUE;
        }
    }
}